

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::Message::~Message(Message *this)

{
  std::
  unique_ptr<discordpp::RoleSubscriptionData,_std::default_delete<discordpp::RoleSubscriptionData>_>
  ::~unique_ptr(&(this->role_subscription_data).super_field<discordpp::RoleSubscriptionData>.t_);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            (&(this->position).super_field<int>.t_);
  std::
  unique_ptr<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>,_std::default_delete<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>_>
  ::~unique_ptr(&(this->stickers).
                 super_field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>.
                 t_);
  std::
  unique_ptr<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>,_std::default_delete<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>_>
  ::~unique_ptr(&(this->sticker_items).
                 super_field<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>
                 .t_);
  std::
  unique_ptr<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>,_std::default_delete<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>_>
  ::~unique_ptr(&(this->components).
                 super_field<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>
                 .t_);
  std::unique_ptr<discordpp::Channel,_std::default_delete<discordpp::Channel>_>::~unique_ptr
            (&(this->thread).super_field<discordpp::Channel>.t_);
  std::
  unique_ptr<discordpp::MessageInteraction,_std::default_delete<discordpp::MessageInteraction>_>::
  ~unique_ptr(&(this->interaction).super_field<discordpp::MessageInteraction>.t_);
  std::unique_ptr<discordpp::Message,_std::default_delete<discordpp::Message>_>::~unique_ptr
            (&(this->referenced_message).super_field<discordpp::Message>.t_);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&(this->flags).super_field<int>.t_);
  std::unique_ptr<discordpp::MessageReference,_std::default_delete<discordpp::MessageReference>_>::
  ~unique_ptr(&(this->message_reference).super_field<discordpp::MessageReference>.t_);
  std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
            (&(this->application_id).super_field<discordpp::Snowflake>.t_);
  std::unique_ptr<discordpp::Application,_std::default_delete<discordpp::Application>_>::~unique_ptr
            (&(this->application).super_field<discordpp::Application>.t_);
  std::unique_ptr<discordpp::MessageActivity,_std::default_delete<discordpp::MessageActivity>_>::
  ~unique_ptr(&(this->activity).super_field<discordpp::MessageActivity>.t_);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&(this->type).t_);
  std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
            (&(this->webhook_id).super_field<discordpp::Snowflake>.t_);
  std::unique_ptr<bool,_std::default_delete<bool>_>::~unique_ptr(&(this->pinned).t_);
  std::
  unique_ptr<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&(this->nonce).
                 super_field<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .t_);
  std::
  unique_ptr<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>,_std::default_delete<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>_>
  ::~unique_ptr(&(this->reactions).
                 super_field<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>
                 .t_);
  std::
  unique_ptr<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
  ::~unique_ptr(&(this->embeds).t_);
  std::
  unique_ptr<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>,_std::default_delete<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_>_>
  ::~unique_ptr(&(this->attachments).t_);
  std::
  unique_ptr<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  ::~unique_ptr(&(this->mention_channels).
                 super_field<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>
                 .t_);
  std::
  unique_ptr<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
  ::~unique_ptr(&(this->mention_roles).t_);
  std::
  unique_ptr<std::vector<discordpp::User,_std::allocator<discordpp::User>_>,_std::default_delete<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>_>
  ::~unique_ptr(&(this->mentions).t_);
  std::unique_ptr<bool,_std::default_delete<bool>_>::~unique_ptr(&(this->mention_everyone).t_);
  std::unique_ptr<bool,_std::default_delete<bool>_>::~unique_ptr(&(this->tts).t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->edited_timestamp).
                 super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->timestamp).t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->content).t_);
  std::unique_ptr<discordpp::User,_std::default_delete<discordpp::User>_>::~unique_ptr
            (&(this->author).t_);
  std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
            (&(this->channel_id).t_);
  std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
            ((unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_> *)this);
  return;
}

Assistant:

Message(
        field<Snowflake> id = uninitialized,
        field<Snowflake> channel_id = uninitialized,
        field<User> author = uninitialized,
        field<std::string> content = uninitialized,
        field<Timestamp> timestamp = uninitialized,
        nullable_field<Timestamp> edited_timestamp = uninitialized,
        field<bool> tts = uninitialized,
        field<bool> mention_everyone = uninitialized,
        field<std::vector<User> > mentions = uninitialized,
        field<std::vector<Snowflake> > mention_roles = uninitialized,
        omittable_field<std::vector<ChannelMention> > mention_channels = omitted,
        field<std::vector<Attachment> > attachments = uninitialized,
        field<std::vector<Embed> > embeds = uninitialized,
        omittable_field<std::vector<Reaction> > reactions = omitted,
        omittable_field<std::variant<int, std::string> > nonce = omitted,
        field<bool> pinned = uninitialized,
        omittable_field<Snowflake> webhook_id = omitted,
        field<int> type = uninitialized,
        omittable_field<MessageActivity> activity = omitted,
        omittable_field<Application> application = omitted,
        omittable_field<Snowflake> application_id = omitted,
        omittable_field<MessageReference> message_reference = omitted,
        omittable_field<int> flags = omitted,
        nullable_omittable_field<Message> referenced_message = omitted,
        omittable_field<MessageInteraction> interaction = omitted,
        omittable_field<Channel> thread = omitted,
        omittable_field<std::vector<Component> > components = omitted,
        omittable_field<std::vector<StickerItem> > sticker_items = omitted,
        omittable_field<std::vector<Sticker> > stickers = omitted,
        omittable_field<int> position = omitted,
        omittable_field<RoleSubscriptionData> role_subscription_data = omitted
    ):
        id(id),
        channel_id(channel_id),
        author(author),
        content(content),
        timestamp(timestamp),
        edited_timestamp(edited_timestamp),
        tts(tts),
        mention_everyone(mention_everyone),
        mentions(mentions),
        mention_roles(mention_roles),
        mention_channels(mention_channels),
        attachments(attachments),
        embeds(embeds),
        reactions(reactions),
        nonce(nonce),
        pinned(pinned),
        webhook_id(webhook_id),
        type(type),
        activity(activity),
        application(application),
        application_id(application_id),
        message_reference(message_reference),
        flags(flags),
        referenced_message(referenced_message),
        interaction(interaction),
        thread(thread),
        components(components),
        sticker_items(sticker_items),
        stickers(stickers),
        position(position),
        role_subscription_data(role_subscription_data)
    {}